

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::__fastunpack55(uint32_t *in,uint64_t *out)

{
  uint uVar1;
  uint32_t *local_8;
  
  uVar1 = *in;
  *out = (ulong)uVar1;
  local_8 = in + 1;
  *out = CONCAT44(in[1],uVar1) & 0x7fffffffffffff;
  Unroller<(unsigned_short)55,_(unsigned_short)1>::Unpack(&local_8,out);
  return;
}

Assistant:

void __fastunpack55(const uint32_t *__restrict in, uint64_t *__restrict out) {
	Unroller<55>::Unpack(in, out);
}